

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::RepeatedPrimitiveFieldGenerator::GeneratePrivateMembers
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  
  io::Printer::Print(printer,&this->variables_,
                     "::google::protobuf::RepeatedField< $type$ > $name$_;\n");
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  if ((bVar1) &&
     ((((this->super_FieldGenerator).options_)->enforce_lite != false ||
      (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x30) + 0xa0) + 0xa8) != 2)))) {
    io::Printer::Print(printer,&this->variables_,"mutable int _$name$_cached_byte_size_;\n");
    return;
  }
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GeneratePrivateMembers(io::Printer* printer) const {
  printer->Print(variables_,
    "::google::protobuf::RepeatedField< $type$ > $name$_;\n");
  if (descriptor_->is_packed() &&
      HasGeneratedMethods(descriptor_->file(), options_)) {
    printer->Print(variables_,
      "mutable int _$name$_cached_byte_size_;\n");
  }
}